

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O0

void __thiscall
dynet::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,ParameterCollection *model)

{
  initializer_list<dynet::Parameter> __l;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  Parameter PVar1;
  Parameter __x;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter p_bh;
  Parameter p_h2h;
  Parameter p_x2h;
  Parameter p_br;
  Parameter p_h2r;
  Parameter p_x2r;
  Parameter p_bz;
  Parameter p_h2z;
  Parameter p_x2z;
  uint i;
  uint layer_input_dim;
  undefined4 in_stack_fffffffffffff948;
  float in_stack_fffffffffffff94c;
  ParameterCollection *in_stack_fffffffffffff950;
  allocator *this_00;
  allocator *__a;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *this_01;
  ParameterCollection *in_stack_fffffffffffff990;
  allocator *paVar2;
  Device *in_stack_fffffffffffff9a8;
  string *in_stack_fffffffffffff9b0;
  Parameter in_stack_fffffffffffff9b8;
  float scale;
  Dim *in_stack_fffffffffffff9c0;
  ParameterCollection *in_stack_fffffffffffff9c8;
  undefined1 local_589;
  ParameterStorage *local_588;
  ParameterStorage *local_580;
  ParameterStorage *local_578;
  ParameterStorage *local_570;
  ParameterStorage *local_568;
  ParameterStorage *local_560;
  ParameterStorage *local_558;
  ParameterStorage *local_550;
  ParameterStorage *local_548;
  ParameterStorage **local_540;
  undefined8 local_538;
  allocator local_511;
  string local_510 [52];
  undefined4 local_4dc;
  undefined4 *local_4d8;
  Dim *in_stack_fffffffffffffb30;
  ParameterCollection *in_stack_fffffffffffffb38;
  size_type in_stack_fffffffffffffb40;
  Device *in_stack_fffffffffffffb48;
  string *in_stack_fffffffffffffb50;
  ParameterInit *in_stack_fffffffffffffb58;
  ParameterStorage *in_stack_fffffffffffffb60;
  Parameter PVar3;
  ParameterCollection *in_stack_fffffffffffffb68;
  string local_490 [32];
  undefined4 local_470 [2];
  undefined4 *local_468;
  undefined8 local_460;
  ParameterStorage *local_430;
  allocator local_421;
  string local_420 [32];
  undefined4 local_400 [2];
  undefined4 *local_3f8;
  undefined8 local_3f0;
  ParameterStorage *local_3c0;
  undefined1 local_3b1 [53];
  undefined4 local_37c;
  undefined4 *local_378;
  undefined8 local_370;
  ParameterStorage *local_340;
  undefined1 local_331 [33];
  undefined4 local_310 [2];
  undefined4 *local_308;
  undefined8 local_300;
  ParameterStorage *local_2d0;
  allocator local_2c1;
  string local_2c0 [32];
  undefined4 local_2a0 [2];
  undefined4 *local_298;
  undefined8 local_290;
  ParameterStorage *local_260;
  allocator local_251;
  string local_250 [52];
  undefined4 local_21c;
  undefined4 *local_218;
  undefined8 local_210;
  ParameterStorage *local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  undefined4 local_1b0 [2];
  undefined4 *local_1a8;
  undefined8 local_1a0;
  ParameterStorage *local_170;
  allocator local_161;
  string local_160 [32];
  undefined4 local_140 [2];
  undefined4 *local_138;
  undefined8 local_130;
  ParameterStorage *local_100;
  uint local_f8;
  allocator local_f1;
  string local_f0 [228];
  uint local_c;
  
  local_f0._220_4_ = in_ECX;
  local_f0._224_4_ = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder((RNNBuilder *)in_stack_fffffffffffff950);
  *in_RDI = &PTR__GRUBuilder_01044160;
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            *)0x96b6d8);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0x96b6f1);
  ParameterCollection::ParameterCollection(in_stack_fffffffffffff990);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0x96b728);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0x96b744);
  *(undefined4 *)(in_RDI + 0x26) = local_f0._220_4_;
  *(uint *)((long)in_RDI + 0x134) = local_c;
  local_f0[0xc0] = local_f0[0xe0];
  local_f0[0xc1] = local_f0[0xe1];
  local_f0[0xc2] = local_f0[0xe2];
  local_f0[0xc3] = local_f0[0xe3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"gru-builder",&local_f1);
  ParameterCollection::add_subcollection
            (in_stack_fffffffffffffb38,(string *)in_stack_fffffffffffffb30);
  ParameterCollection::operator=
            (in_stack_fffffffffffff950,
             (ParameterCollection *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  ParameterCollection::~ParameterCollection(in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  for (local_f8 = 0; scale = (float)((ulong)in_stack_fffffffffffff9b8.p >> 0x20), local_f8 < local_c
      ; local_f8 = local_f8 + 1) {
    local_140[0]._0_1_ = local_f0[0xdc];
    local_140[0]._1_1_ = local_f0[0xdd];
    local_140[0]._2_1_ = local_f0[0xde];
    local_140[0]._3_1_ = local_f0[0xdf];
    local_140[1]._0_1_ = local_f0[0xc0];
    local_140[1]._1_1_ = local_f0[0xc1];
    local_140[1]._2_1_ = local_f0[0xc2];
    local_140[1]._3_1_ = local_f0[0xc3];
    local_138 = local_140;
    local_130 = 2;
    x._M_len = in_stack_fffffffffffffb40;
    x._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"",&local_161);
    local_100 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,scale,
                           in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    local_1b0[0]._0_1_ = local_f0[0xdc];
    local_1b0[0]._1_1_ = local_f0[0xdd];
    local_1b0[0]._2_1_ = local_f0[0xde];
    local_1b0[0]._3_1_ = local_f0[0xdf];
    local_1b0[1]._0_1_ = local_f0[0xdc];
    local_1b0[1]._1_1_ = local_f0[0xdd];
    local_1b0[1]._2_1_ = local_f0[0xde];
    local_1b0[1]._3_1_ = local_f0[0xdf];
    local_1a8 = local_1b0;
    local_1a0 = 2;
    x_00._M_len = in_stack_fffffffffffffb40;
    x_00._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"",&local_1d1);
    local_170 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,scale,
                           in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_21c._0_1_ = local_f0[0xdc];
    local_21c._1_1_ = local_f0[0xdd];
    local_21c._2_1_ = local_f0[0xde];
    local_21c._3_1_ = local_f0[0xdf];
    local_218 = &local_21c;
    local_210 = 1;
    x_01._M_len = in_stack_fffffffffffffb40;
    x_01._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_01);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"",&local_251);
    local_1e0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffffb68,(Dim *)in_stack_fffffffffffffb60,
                           in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                           in_stack_fffffffffffffb48);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x96bb41);
    local_2a0[0]._0_1_ = local_f0[0xdc];
    local_2a0[0]._1_1_ = local_f0[0xdd];
    local_2a0[0]._2_1_ = local_f0[0xde];
    local_2a0[0]._3_1_ = local_f0[0xdf];
    local_2a0[1]._0_1_ = local_f0[0xc0];
    local_2a0[1]._1_1_ = local_f0[0xc1];
    local_2a0[1]._2_1_ = local_f0[0xc2];
    local_2a0[1]._3_1_ = local_f0[0xc3];
    local_298 = local_2a0;
    local_290 = 2;
    x_02._M_len = in_stack_fffffffffffffb40;
    x_02._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"",&local_2c1);
    local_260 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,scale,
                           in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    in_stack_fffffffffffff9c8 = (ParameterCollection *)(in_RDI + 0xc);
    local_310[0]._0_1_ = local_f0[0xdc];
    local_310[0]._1_1_ = local_f0[0xdd];
    local_310[0]._2_1_ = local_f0[0xde];
    local_310[0]._3_1_ = local_f0[0xdf];
    local_310[1]._0_1_ = local_f0[0xdc];
    local_310[1]._1_1_ = local_f0[0xdd];
    local_310[1]._2_1_ = local_f0[0xde];
    local_310[1]._3_1_ = local_f0[0xdf];
    local_308 = local_310;
    local_300 = 2;
    x_03._M_len = in_stack_fffffffffffffb40;
    x_03._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_03);
    in_stack_fffffffffffff9c0 = (Dim *)local_331;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_331 + 1),"",(allocator *)in_stack_fffffffffffff9c0);
    in_stack_fffffffffffff9b8 =
         ParameterCollection::add_parameters
                   (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,scale,
                    in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_2d0 = in_stack_fffffffffffff9b8.p;
    std::__cxx11::string::~string((string *)(local_331 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_331);
    in_stack_fffffffffffff9b0 = (string *)(in_RDI + 0xc);
    local_37c._0_1_ = local_f0[0xdc];
    local_37c._1_1_ = local_f0[0xdd];
    local_37c._2_1_ = local_f0[0xde];
    local_37c._3_1_ = local_f0[0xdf];
    local_378 = &local_37c;
    local_370 = 1;
    x_04._M_len = in_stack_fffffffffffffb40;
    x_04._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_04);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    in_stack_fffffffffffff9a8 = (Device *)local_3b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3b1 + 1),"",(allocator *)in_stack_fffffffffffff9a8);
    local_340 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffffb68,(Dim *)in_stack_fffffffffffffb60,
                           in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                           in_stack_fffffffffffffb48);
    std::__cxx11::string::~string((string *)(local_3b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3b1);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x96be2d);
    local_400[0]._0_1_ = local_f0[0xdc];
    local_400[0]._1_1_ = local_f0[0xdd];
    local_400[0]._2_1_ = local_f0[0xde];
    local_400[0]._3_1_ = local_f0[0xdf];
    local_400[1]._0_1_ = local_f0[0xc0];
    local_400[1]._1_1_ = local_f0[0xc1];
    local_400[1]._2_1_ = local_f0[0xc2];
    local_400[1]._3_1_ = local_f0[0xc3];
    local_3f8 = local_400;
    local_3f0 = 2;
    x_05._M_len = in_stack_fffffffffffffb40;
    x_05._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_05);
    paVar2 = &local_421;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"",paVar2);
    PVar1 = ParameterCollection::add_parameters
                      (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                       (float)((ulong)in_stack_fffffffffffff9b8.p >> 0x20),in_stack_fffffffffffff9b0
                       ,in_stack_fffffffffffff9a8);
    local_3c0 = PVar1.p;
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    this_01 = (vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)(in_RDI + 0xc);
    local_470[0]._0_1_ = local_f0[0xdc];
    local_470[0]._1_1_ = local_f0[0xdd];
    local_470[0]._2_1_ = local_f0[0xde];
    local_470[0]._3_1_ = local_f0[0xdf];
    local_470[1]._0_1_ = local_f0[0xdc];
    local_470[1]._1_1_ = local_f0[0xdd];
    local_470[1]._2_1_ = local_f0[0xde];
    local_470[1]._3_1_ = local_f0[0xdf];
    local_468 = local_470;
    local_460 = 2;
    x_06._M_len = in_stack_fffffffffffffb40;
    x_06._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim(in_stack_fffffffffffffb30,x_06);
    __a = (allocator *)&stack0xfffffffffffffb6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"",__a);
    local_430 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                           (float)((ulong)in_stack_fffffffffffff9b8.p >> 0x20),
                           in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb6f);
    local_4dc._0_1_ = local_f0[0xdc];
    local_4dc._1_1_ = local_f0[0xdd];
    local_4dc._2_1_ = local_f0[0xde];
    local_4dc._3_1_ = local_f0[0xdf];
    local_4d8 = &local_4dc;
    in_stack_fffffffffffffb30 = (Dim *)0x1;
    x_07._M_len = in_stack_fffffffffffffb40;
    x_07._M_array = (iterator)in_stack_fffffffffffffb38;
    Dim::Dim((Dim *)0x1,x_07);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    this_00 = &local_511;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,"",this_00);
    __x = ParameterCollection::add_parameters
                    (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    PVar3 = __x;
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x96c101);
    local_548 = PVar3.p;
    local_f0[0xc0] = local_f0[0xdc];
    local_f0[0xc1] = local_f0[0xdd];
    local_f0[0xc2] = local_f0[0xde];
    local_f0[0xc3] = local_f0[0xdf];
    local_588 = local_100;
    local_580 = local_170;
    local_578 = local_1e0;
    local_570 = local_260;
    local_568 = local_2d0;
    local_560 = local_340;
    local_558 = local_3c0;
    local_550 = local_430;
    local_540 = &local_588;
    local_538 = 9;
    in_stack_fffffffffffff950 = (ParameterCollection *)&local_589;
    in_stack_fffffffffffffb60 = local_548;
    std::allocator<dynet::Parameter>::allocator((allocator<dynet::Parameter> *)0x96c1cd);
    __l._M_len = (size_type)paVar2;
    __l._M_array = (iterator)PVar1.p;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (this_01,__l,(allocator_type *)__a);
    std::allocator<dynet::Parameter>::~allocator((allocator<dynet::Parameter> *)0x96c1fe);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 *)this_00,(value_type *)__x.p);
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_00);
  }
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("gru-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameter p_x2z = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2z = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bz = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // r
    Parameter p_x2r = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2r = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_br = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // h
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bh = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
  dropout_rate = 0.f;
}